

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.cc
# Opt level: O1

void GD::multipredict<true,true>
               (gd *g,base_learner *param_2,example *ec,size_t count,size_t step,
               polyprediction *pred,bool finalize_predictions)

{
  uint64_t *puVar1;
  vw *all;
  vw *pvVar2;
  polyprediction *ppVar3;
  size_t sVar4;
  float fVar5;
  multipredict_info<sparse_parameters> mp;
  multipredict_info<sparse_parameters> local_58;
  
  all = g->all;
  ppVar3 = pred;
  sVar4 = count;
  if (count != 0) {
    do {
      ppVar3->scalar = (ec->l).simple.initial;
      sVar4 = sVar4 - 1;
      ppVar3 = ppVar3 + 1;
    } while (sVar4 != 0);
  }
  pvVar2 = g->all;
  local_58.count = count;
  local_58.step = step;
  local_58.pred = pred;
  if ((pvVar2->weights).sparse == false) {
    local_58.weights = (sparse_parameters *)&(pvVar2->weights).dense_weights;
    local_58.gravity = (float)all->sd->gravity;
    foreach_feature<GD::multipredict_info<dense_parameters>,_unsigned_long,_&GD::vec_add_trunc_multipredict>
              (all,ec,(multipredict_info<dense_parameters> *)&local_58);
  }
  else {
    local_58.weights = &(pvVar2->weights).sparse_weights;
    local_58.gravity = (float)all->sd->gravity;
    foreach_feature<GD::multipredict_info<sparse_parameters>,_unsigned_long,_&GD::vec_add_trunc_multipredict>
              (all,ec,&local_58);
  }
  ppVar3 = pred;
  sVar4 = count;
  if (count != 0 && all->sd->contraction != 1.0) {
    do {
      ppVar3->scalar = (float)all->sd->contraction * ppVar3->scalar;
      sVar4 = sVar4 - 1;
      ppVar3 = ppVar3 + 1;
    } while (sVar4 != 0);
  }
  ppVar3 = pred;
  sVar4 = count;
  if (finalize_predictions && count != 0) {
    do {
      fVar5 = finalize_prediction(all->sd,ppVar3->scalar);
      ppVar3->scalar = fVar5;
      sVar4 = sVar4 - 1;
      ppVar3 = ppVar3 + 1;
    } while (sVar4 != 0);
  }
  sVar4 = count;
  if (count != 0) {
    do {
      (ec->pred).scalar = pred->scalar;
      print_audit_features(all,ec);
      puVar1 = &(ec->super_example_predict).ft_offset;
      *puVar1 = *puVar1 + step;
      pred = pred + 1;
      sVar4 = sVar4 - 1;
    } while (sVar4 != 0);
  }
  puVar1 = &(ec->super_example_predict).ft_offset;
  *puVar1 = *puVar1 - step * count;
  return;
}

Assistant:

void multipredict(
    gd& g, base_learner&, example& ec, size_t count, size_t step, polyprediction* pred, bool finalize_predictions)
{
  vw& all = *g.all;
  for (size_t c = 0; c < count; c++) pred[c].scalar = ec.l.simple.initial;
  if (g.all->weights.sparse)
  {
    multipredict_info<sparse_parameters> mp = {
        count, step, pred, g.all->weights.sparse_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<sparse_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  else
  {
    multipredict_info<dense_parameters> mp = {count, step, pred, g.all->weights.dense_weights, (float)all.sd->gravity};
    if (l1)
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_trunc_multipredict>(all, ec, mp);
    else
      foreach_feature<multipredict_info<dense_parameters>, uint64_t, vec_add_multipredict>(all, ec, mp);
  }
  if (all.sd->contraction != 1.)
    for (size_t c = 0; c < count; c++) pred[c].scalar *= (float)all.sd->contraction;
  if (finalize_predictions)
    for (size_t c = 0; c < count; c++) pred[c].scalar = finalize_prediction(all.sd, pred[c].scalar);
  if (audit)
  {
    for (size_t c = 0; c < count; c++)
    {
      ec.pred.scalar = pred[c].scalar;
      print_audit_features(all, ec);
      ec.ft_offset += (uint64_t)step;
    }
    ec.ft_offset -= (uint64_t)(step * count);
  }
}